

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

pizza_cutter * parse_input_file(pizza_cutter *__return_storage_ptr__,string *file_name)

{
  byte bVar1;
  char *pcVar2;
  istream *piVar3;
  value_type local_298;
  char local_28d;
  int local_28c;
  undefined1 local_288 [3];
  char val;
  int j;
  pizza_row_t row;
  undefined1 local_268 [4];
  int i;
  pizza_t pizza;
  int max_total;
  int min_each;
  int cols;
  int rows;
  istream local_220 [8];
  ifstream ifs;
  string *file_name_local;
  
  std::ifstream::ifstream(local_220,file_name,8);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) == 0) {
    pcVar2 = (char *)__cxa_allocate_exception(0x20);
    std::error_code::error_code<std::io_errc,void>((error_code *)&cols,stream);
    std::ios_base::failure[abi:cxx11]::failure(pcVar2,(error_code *)"Cannot open the input file.");
    __cxa_throw(pcVar2,&std::ios_base::failure[abi:cxx11]::typeinfo,
                std::ios_base::failure[abi:cxx11]::~failure);
  }
  piVar3 = (istream *)std::istream::operator>>(local_220,&min_each);
  piVar3 = (istream *)std::istream::operator>>(piVar3,&max_total);
  piVar3 = (istream *)
           std::istream::operator>>
                     (piVar3,(int *)((long)&pizza.
                                            super__Vector_base<std::vector<pizza_cell,_std::allocator<pizza_cell>_>,_std::allocator<std::vector<pizza_cell,_std::allocator<pizza_cell>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage + 4))
  ;
  std::istream::operator>>
            (piVar3,(int *)&pizza.
                            super__Vector_base<std::vector<pizza_cell,_std::allocator<pizza_cell>_>,_std::allocator<std::vector<pizza_cell,_std::allocator<pizza_cell>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::istream::get();
  std::
  vector<std::vector<pizza_cell,_std::allocator<pizza_cell>_>,_std::allocator<std::vector<pizza_cell,_std::allocator<pizza_cell>_>_>_>
  ::vector((vector<std::vector<pizza_cell,_std::allocator<pizza_cell>_>,_std::allocator<std::vector<pizza_cell,_std::allocator<pizza_cell>_>_>_>
            *)local_268);
  for (row.super__Vector_base<pizza_cell,_std::allocator<pizza_cell>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      row.super__Vector_base<pizza_cell,_std::allocator<pizza_cell>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ < min_each;
      row.super__Vector_base<pizza_cell,_std::allocator<pizza_cell>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ =
           row.super__Vector_base<pizza_cell,_std::allocator<pizza_cell>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
    std::vector<pizza_cell,_std::allocator<pizza_cell>_>::vector
              ((vector<pizza_cell,_std::allocator<pizza_cell>_> *)local_288);
    std::vector<pizza_cell,_std::allocator<pizza_cell>_>::reserve
              ((vector<pizza_cell,_std::allocator<pizza_cell>_> *)local_288,(long)max_total);
    for (local_28c = 0; local_28c < max_total; local_28c = local_28c + 1) {
      local_298.ingr = std::istream::get();
      local_298.owner = -1;
      local_28d = local_298.ingr;
      std::vector<pizza_cell,_std::allocator<pizza_cell>_>::push_back
                ((vector<pizza_cell,_std::allocator<pizza_cell>_> *)local_288,&local_298);
    }
    std::
    vector<std::vector<pizza_cell,_std::allocator<pizza_cell>_>,_std::allocator<std::vector<pizza_cell,_std::allocator<pizza_cell>_>_>_>
    ::push_back((vector<std::vector<pizza_cell,_std::allocator<pizza_cell>_>,_std::allocator<std::vector<pizza_cell,_std::allocator<pizza_cell>_>_>_>
                 *)local_268,(value_type *)local_288);
    std::istream::get();
    std::vector<pizza_cell,_std::allocator<pizza_cell>_>::~vector
              ((vector<pizza_cell,_std::allocator<pizza_cell>_> *)local_288);
  }
  pizza_cutter::pizza_cutter
            (__return_storage_ptr__,
             pizza.
             super__Vector_base<std::vector<pizza_cell,_std::allocator<pizza_cell>_>,_std::allocator<std::vector<pizza_cell,_std::allocator<pizza_cell>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
             (int)pizza.
                  super__Vector_base<std::vector<pizza_cell,_std::allocator<pizza_cell>_>,_std::allocator<std::vector<pizza_cell,_std::allocator<pizza_cell>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(pizza_t *)local_268);
  std::
  vector<std::vector<pizza_cell,_std::allocator<pizza_cell>_>,_std::allocator<std::vector<pizza_cell,_std::allocator<pizza_cell>_>_>_>
  ::~vector((vector<std::vector<pizza_cell,_std::allocator<pizza_cell>_>,_std::allocator<std::vector<pizza_cell,_std::allocator<pizza_cell>_>_>_>
             *)local_268);
  std::ifstream::~ifstream(local_220);
  return __return_storage_ptr__;
}

Assistant:

pizza_cutter parse_input_file(const std::string& file_name) {
    std::ifstream ifs(file_name);

    if (!ifs.is_open()) {
        throw std::ios_base::failure("Cannot open the input file.");
    }

    int rows, cols, min_each, max_total;
    ifs >> rows >> cols >> min_each >> max_total;
    ifs.get();

    pizza_t pizza;
    for (int i = 0; i < rows; ++i) {
        pizza_row_t row;
        row.reserve(cols);

        for (int j = 0; j < cols; ++j) {
            char val = ifs.get();
            row.push_back(pizza_cell{val});
        }

        pizza.push_back(std::move(row));
        ifs.get();
    }

    return pizza_cutter(min_each, max_total, std::move(pizza));
}